

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetFloorScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  FSectorTagIterator local_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  
  if (arg0 == 0) {
    local_40.start = 0;
  }
  else {
    local_40.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_40.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_40);
  if (-1 < (int)uVar1) {
    dVar2 = (double)arg2 / 100.0 + (double)arg1;
    dVar3 = (double)arg4 / 100.0 + (double)arg3;
    local_38 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                       (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
    local_28 = (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                       (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
    uStack_30 = 0;
    do {
      if ((local_38 != 0.0) || (NAN(local_38))) {
        sectors[uVar1].planes[0].xform.xScale = local_38;
      }
      if ((local_28 != 0.0) || (NAN(local_28))) {
        sectors[uVar1].planes[0].xform.yScale = local_28;
      }
      uVar1 = FSectorTagIterator::Next(&local_40);
    } while (-1 < (int)uVar1);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorScale)
// Sector_SetFloorScale (tag, x-int, x-frac, y-int, y-frac)
{
	double xscale = arg1 + arg2 / 100.;
	double yscale = arg3 + arg4 / 100.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (xscale)
			sectors[secnum].SetXScale(sector_t::floor, xscale);
		if (yscale)
			sectors[secnum].SetYScale(sector_t::floor, yscale);
	}
	return true;
}